

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O0

QPointF __thiscall QVariant::toPointF(QVariant *this)

{
  QPointF QVar1;
  
  QVar1 = qvariant_cast<QPointF>(this);
  return QVar1;
}

Assistant:

QPointF QVariant::toPointF() const
{
    return qvariant_cast<QPointF>(*this);
}